

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

table_type * __thiscall
toml::basic_value<toml::type_config>::as_table_abi_cxx11_(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == table) {
    return (table_type *)(this->field_1).integer_.value;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"toml::value::as_table()","");
  throw_bad_cast(this,&local_38,table);
}

Assistant:

table_type& as_table()
    {
        if(this->type_ != value_t::table)
        {
            this->throw_bad_cast("toml::value::as_table()", value_t::table);
        }
        return this->table_.value.get();
    }